

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O3

shared_ptr<BER_CONTAINER> __thiscall OIDCallback::buildTypeWithValue(OIDCallback *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar2;
  undefined1 local_21;
  OIDType *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (OIDType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OIDType,std::allocator<OIDType>,std::__cxx11::string_const&>
            (&local_18,&local_20,(allocator<OIDType> *)&local_21,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x18));
  _Var1._M_pi = extraout_RDX;
  if (local_20->valid == true) {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)local_20;
    (this->super_ValueCallback).OID = (SortableOIDType *)local_18._M_pi;
  }
  else {
    (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)0x0;
    (this->super_ValueCallback).OID = (SortableOIDType *)0x0;
    if ((SortableOIDType *)local_18._M_pi != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._M_pi);
      _Var1._M_pi = extraout_RDX_00;
    }
  }
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> OIDCallback::buildTypeWithValue(){
    auto oid = std::make_shared<OIDType>(this->value);
    if(!oid->valid) return nullptr;
    return oid;
}